

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::ObjFileImporter::createTopology
          (ObjFileImporter *this,Model *pModel,Object *pData,uint meshIndex)

{
  value_type pFVar1;
  bool bVar2;
  _Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_> *p_Var3;
  aiMesh *this_00;
  ulong uVar4;
  pointer paVar5;
  Face *pFVar6;
  reference ppFVar7;
  size_type sVar8;
  ulong *puVar9;
  uint *puVar10;
  aiFace *paVar11;
  uint uVar12;
  aiFace *local_e8;
  uint uiNumIndices;
  aiFace *pFace;
  aiFace *f_1;
  size_t i_1;
  aiFace *f;
  size_t i;
  Face *inp_1;
  size_t index_1;
  uint outIndex;
  uint uiIdxCount;
  Face *inp;
  size_t index;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> local_40;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> pMesh;
  Mesh *pObjMesh;
  uint meshIndex_local;
  Object *pData_local;
  Model *pModel_local;
  ObjFileImporter *this_local;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x13c,
                  "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                 );
  }
  if (pData == (Object *)0x0) {
    this_local = (ObjFileImporter *)0x0;
  }
  else {
    p_Var3 = (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_> *)
             std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::
             operator[](&pModel->m_Meshes,(ulong)meshIndex);
    pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         *(__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> *)
          &p_Var3->super__Head_base<0UL,_aiMesh_*,_false>;
    if ((tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
        pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl == (_Head_base<0UL,_aiMesh_*,_false>)0x0
       ) {
      this_local = (ObjFileImporter *)0x0;
    }
    else {
      bVar2 = std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::empty
                        ((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                          *)((long)pMesh._M_t.
                                   super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x20));
      if (bVar2) {
        this_local = (ObjFileImporter *)0x0;
      }
      else {
        this_00 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_00);
        std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::
        unique_ptr<std::default_delete<aiMesh>,void>
                  ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&local_40,this_00);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          aiString::Set(&paVar5->mName,
                        (string *)
                        pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
        }
        for (inp = (Face *)0x0;
            pFVar6 = (Face *)std::
                             vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                             ::size((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                     *)((long)pMesh._M_t.
                                              super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                              .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl +
                                       0x20)), inp < pFVar6;
            inp = (Face *)((long)&inp->m_PrimitiveType + 1)) {
          ppFVar7 = std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
                    operator[]((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                *)((long)pMesh._M_t.
                                         super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                         .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x20
                                  ),(size_type)inp);
          pFVar1 = *ppFVar7;
          if (pFVar1 == (value_type)0x0) {
            __assert_fail("__null != inp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Obj/ObjFileImporter.cpp"
                          ,0x154,
                          "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                         );
          }
          if (pFVar1->m_PrimitiveType == aiPrimitiveType_LINE) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (&pFVar1->m_vertices);
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mNumFaces = (int)sVar8 + -1 + paVar5->mNumFaces;
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | 2;
          }
          else if (pFVar1->m_PrimitiveType == aiPrimitiveType_POINT) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (&pFVar1->m_vertices);
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mNumFaces = (int)sVar8 + paVar5->mNumFaces;
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | 1;
          }
          else {
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mNumFaces = paVar5->mNumFaces + 1;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (&pFVar1->m_vertices);
            if (sVar8 < 4) {
              paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
              paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | 4;
            }
            else {
              paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
              paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | 8;
            }
          }
        }
        index_1._4_4_ = 0;
        paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
        if (paVar5->mNumFaces != 0) {
          paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          uVar4 = (ulong)paVar5->mNumFaces;
          puVar9 = (ulong *)operator_new__(uVar4 << 4 | 8);
          *puVar9 = uVar4;
          paVar11 = (aiFace *)(puVar9 + 1);
          if (uVar4 != 0) {
            local_e8 = paVar11;
            do {
              aiFace::aiFace(local_e8);
              local_e8 = local_e8 + 1;
            } while (local_e8 != paVar11 + uVar4);
          }
          paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          paVar5->mFaces = paVar11;
          if (*(int *)((long)pMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                             _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 100) != -1) {
            uVar12 = *(uint *)((long)pMesh._M_t.
                                     super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 100);
            paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar5->mMaterialIndex = uVar12;
          }
          index_1._0_4_ = 0;
          for (inp_1 = (Face *)0x0;
              pFVar6 = (Face *)std::
                               vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                               ::size((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                       *)((long)pMesh._M_t.
                                                super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                                .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl
                                         + 0x20)), inp_1 < pFVar6;
              inp_1 = (Face *)((long)&inp_1->m_PrimitiveType + 1)) {
            ppFVar7 = std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                      ::operator[]((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                    *)((long)pMesh._M_t.
                                             super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                             .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl +
                                      0x20),(size_type)inp_1);
            pFVar1 = *ppFVar7;
            if (pFVar1->m_PrimitiveType == aiPrimitiveType_LINE) {
              for (f = (aiFace *)0x0;
                  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    (&pFVar1->m_vertices), f < (aiFace *)(sVar8 - 1);
                  f = (aiFace *)((long)&f->mNumIndices + 1)) {
                paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                                   (&local_40);
                paVar11 = paVar5->mFaces;
                uVar4 = (ulong)(uint)index_1;
                index_1._0_4_ = (uint)index_1 + 1;
                paVar11[uVar4].mNumIndices = 2;
                index_1._4_4_ = index_1._4_4_ + 2;
                puVar10 = (uint *)operator_new__(8);
                paVar11[uVar4].mIndices = puVar10;
              }
            }
            else if (pFVar1->m_PrimitiveType == aiPrimitiveType_POINT) {
              for (f_1 = (aiFace *)0x0;
                  paVar11 = (aiFace *)
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                      (&pFVar1->m_vertices), f_1 < paVar11;
                  f_1 = (aiFace *)((long)&f_1->mNumIndices + 1)) {
                paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                                   (&local_40);
                paVar11 = paVar5->mFaces;
                uVar4 = (ulong)(uint)index_1;
                index_1._0_4_ = (uint)index_1 + 1;
                paVar11[uVar4].mNumIndices = 1;
                index_1._4_4_ = index_1._4_4_ + 1;
                puVar10 = (uint *)operator_new__(4);
                paVar11[uVar4].mIndices = puVar10;
              }
            }
            else {
              paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
              uVar12 = (uint)index_1 + 1;
              paVar11 = paVar5->mFaces + (uint)index_1;
              ppFVar7 = std::
                        vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
                        operator[]((vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                    *)((long)pMesh._M_t.
                                             super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                                             .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl +
                                      0x20),(size_type)inp_1);
              sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                (&(*ppFVar7)->m_vertices);
              paVar11->mNumIndices = (uint)sVar8;
              index_1._4_4_ = (uint)sVar8 + index_1._4_4_;
              index_1._0_4_ = uVar12;
              if (paVar11->mNumIndices != 0) {
                puVar10 = (uint *)operator_new__((sVar8 & 0xffffffff) << 2);
                paVar11->mIndices = puVar10;
              }
            }
          }
        }
        paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::get(&local_40);
        createVertexArray(this,pModel,pData,meshIndex,paVar5,index_1._4_4_);
        this_local = (ObjFileImporter *)
                     std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release(&local_40);
        std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&local_40);
      }
    }
  }
  return (aiMesh *)this_local;
}

Assistant:

aiMesh *ObjFileImporter::createTopology( const ObjFile::Model* pModel, const ObjFile::Object* pData, unsigned int meshIndex ) {
    // Checking preconditions
    ai_assert( NULL != pModel );

    if( NULL == pData ) {
        return NULL;
    }

    // Create faces
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ meshIndex ];
    if( !pObjMesh ) {
        return NULL;
    }

    if( pObjMesh->m_Faces.empty() ) {
        return NULL;
    }

    std::unique_ptr<aiMesh> pMesh(new aiMesh);
    if( !pObjMesh->m_name.empty() ) {
        pMesh->mName.Set( pObjMesh->m_name );
    }

    for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++)
    {
        ObjFile::Face *const inp = pObjMesh->m_Faces[ index ];
        ai_assert( NULL != inp  );

        if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size() - 1);
            pMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
        } else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size());
            pMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
        } else {
            ++pMesh->mNumFaces;
            if (inp->m_vertices.size() > 3) {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            }
        }
    }

    unsigned int uiIdxCount( 0u );
    if ( pMesh->mNumFaces > 0 ) {
        pMesh->mFaces = new aiFace[ pMesh->mNumFaces ];
        if ( pObjMesh->m_uiMaterialIndex != ObjFile::Mesh::NoMaterial ) {
            pMesh->mMaterialIndex = pObjMesh->m_uiMaterialIndex;
        }

        unsigned int outIndex( 0 );

        // Copy all data from all stored meshes
        for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++) {
            ObjFile::Face* const inp = pObjMesh->m_Faces[ index ];
            if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
                for(size_t i = 0; i < inp->m_vertices.size() - 1; ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 2;
                    f.mIndices = new unsigned int[2];
                }
                continue;
            }
            else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
                for(size_t i = 0; i < inp->m_vertices.size(); ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 1;
                    f.mIndices = new unsigned int[1];
                }
                continue;
            }

            aiFace *pFace = &pMesh->mFaces[ outIndex++ ];
            const unsigned int uiNumIndices = (unsigned int) pObjMesh->m_Faces[ index ]->m_vertices.size();
            uiIdxCount += pFace->mNumIndices = (unsigned int) uiNumIndices;
            if (pFace->mNumIndices > 0) {
                pFace->mIndices = new unsigned int[ uiNumIndices ];
            }
        }
    }

    // Create mesh vertices
    createVertexArray(pModel, pData, meshIndex, pMesh.get(), uiIdxCount);

    return pMesh.release();
}